

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest::ExpectPriceUpdateEvent
          (PriceSyncDecoderTest *this,PriceEvent *event)

{
  bool bVar1;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  PriceEvent *event_local;
  PriceSyncDecoderTest *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)event;
  (*event->_vptr_PriceEvent[3])();
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((EqHelper<false> *)local_28,"\"PriceUpdateEvent\"","event.GetType()",
             (char (*) [17])"PriceUpdateEvent",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_decoder_test.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

void PriceSyncDecoderTest::ExpectPriceUpdateEvent(PriceEvent& event)
{
    EXPECT_EQ("PriceUpdateEvent", event.GetType());
}